

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotBarsEx<ImPlot::GetterXsYs<float>>
               (char *label_id,GetterXsYs<float> *getter,double width)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  float *pfVar7;
  float *pfVar8;
  ImPlotPlot *pIVar9;
  ImPlotRange IVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  ImPlotContext *pIVar14;
  bool bVar15;
  ImU32 col;
  ImU32 col_00;
  long lVar16;
  ImDrawList *this;
  int iVar17;
  int iVar18;
  int iVar19;
  ImPlotRange *pIVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  double dVar28;
  ImVec2 b;
  ImVec2 a;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar15 = BeginItem(label_id,1);
  pIVar14 = GImPlot;
  if (bVar15) {
    dVar28 = width * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar17 = getter->Count, 0 < iVar17)) {
      pfVar7 = getter->Xs;
      pfVar8 = getter->Ys;
      iVar18 = getter->Offset;
      iVar3 = getter->Stride;
      pIVar9 = GImPlot->CurrentPlot;
      iVar4 = pIVar9->CurrentYAxis;
      uVar5 = (pIVar9->XAxis).Flags;
      pIVar20 = GImPlot->ExtentsY + iVar4;
      uVar6 = pIVar9->YAxis[iVar4].Flags;
      iVar19 = 0;
      do {
        lVar16 = (long)(((iVar18 + iVar19) % iVar17 + iVar17) % iVar17) * (long)iVar3;
        dVar24 = (double)*(float *)((long)pfVar7 + lVar16);
        fVar1 = *(float *)((long)pfVar8 + lVar16);
        dVar25 = (double)fVar1;
        dVar26 = dVar24 - dVar28;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar26) < 0x7ff0000000000000) {
LAB_001f500c:
            if ((0.0 < dVar26) || ((uVar5 & 0x20) == 0)) {
              dVar12 = (pIVar14->ExtentsX).Min;
              dVar13 = (pIVar14->ExtentsX).Max;
              uVar21 = -(ulong)(dVar26 < dVar12);
              uVar22 = -(ulong)(dVar13 < dVar26);
              (pIVar14->ExtentsX).Min = (double)(~uVar21 & (ulong)dVar12 | (ulong)dVar26 & uVar21);
              (pIVar14->ExtentsX).Max = (double)(~uVar22 & (ulong)dVar13 | (ulong)dVar26 & uVar22);
            }
          }
        }
        else if ((((long)ABS(dVar26) < 0x7ff0000000000000) &&
                 (pIVar9->YAxis[iVar4].Range.Min <= dVar25)) &&
                (dVar25 <= pIVar9->YAxis[iVar4].Range.Max)) goto LAB_001f500c;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar25) < 0x7ff0000000000000) {
LAB_001f5092:
            if ((0.0 < fVar1) || ((uVar6 & 0x20) == 0)) {
              dVar26 = pIVar14->ExtentsY[iVar4].Max;
              uVar21 = -(ulong)(dVar25 < pIVar20->Min);
              uVar22 = -(ulong)(dVar26 < dVar25);
              pIVar20->Min = (double)(~uVar21 & (ulong)pIVar20->Min | (ulong)dVar25 & uVar21);
              pIVar14->ExtentsY[iVar4].Max =
                   (double)(~uVar22 & (ulong)dVar26 | (ulong)dVar25 & uVar22);
            }
          }
        }
        else if ((((long)ABS(dVar25) < 0x7ff0000000000000) && ((pIVar9->XAxis).Range.Min <= dVar26))
                && (dVar26 <= (pIVar9->XAxis).Range.Max)) goto LAB_001f5092;
        dVar24 = dVar24 + dVar28;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar24) < 0x7ff0000000000000) {
LAB_001f5107:
            if ((0.0 < dVar24) || ((uVar5 & 0x20) == 0)) {
              dVar25 = (pIVar14->ExtentsX).Min;
              dVar26 = (pIVar14->ExtentsX).Max;
              uVar22 = -(ulong)(dVar24 < dVar25);
              uVar23 = -(ulong)(dVar26 < dVar24);
              uVar21 = (ulong)dVar24 & uVar23;
              auVar27._0_8_ = ~uVar22 & (ulong)dVar25;
              auVar27._8_8_ = ~uVar23 & (ulong)dVar26;
              auVar11._8_4_ = (int)uVar21;
              auVar11._0_8_ = (ulong)dVar24 & uVar22;
              auVar11._12_4_ = (int)(uVar21 >> 0x20);
              pIVar14->ExtentsX = (ImPlotRange)(auVar27 | auVar11);
            }
          }
        }
        else if ((((long)ABS(dVar24) < 0x7ff0000000000000) &&
                 (pIVar9->YAxis[iVar4].Range.Min <= 0.0)) && (0.0 <= pIVar9->YAxis[iVar4].Range.Max)
                ) goto LAB_001f5107;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((uVar6 & 0x20) == 0) {
LAB_001f517a:
            dVar24 = pIVar14->ExtentsY[iVar4].Max;
            uVar21 = -(ulong)(0.0 <= dVar24) & (ulong)dVar24;
            IVar10.Max._0_4_ = (int)uVar21;
            IVar10.Min = (double)(-(ulong)(pIVar20->Min <= 0.0) & (ulong)pIVar20->Min);
            IVar10.Max._4_4_ = (int)(uVar21 >> 0x20);
            *pIVar20 = IVar10;
          }
        }
        else if ((((uVar6 & 0x20) == 0) && ((pIVar9->XAxis).Range.Min <= dVar24)) &&
                (dVar24 <= (pIVar9->XAxis).Range.Max)) goto LAB_001f517a;
        iVar19 = iVar19 + 1;
      } while (iVar17 != iVar19);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar14->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar14->NextItemData).Colors + 1);
    iVar17 = getter->Count;
    if (0 < iVar17) {
      bVar15 = (pIVar14->NextItemData).RenderFill;
      bVar2 = (pIVar14->NextItemData).RenderLine;
      iVar18 = 0;
      do {
        lVar16 = (long)(((getter->Offset + iVar18) % iVar17 + iVar17) % iVar17) *
                 (long)getter->Stride;
        fVar1 = *(float *)((long)getter->Ys + lVar16);
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          dVar24 = (double)*(float *)((long)getter->Xs + lVar16);
          local_38 = PlotToPixels(dVar24 - dVar28,(double)fVar1,-1);
          local_40 = PlotToPixels(dVar24 + dVar28,0.0,-1);
          if ((pIVar14->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar15 ^ 1U | col != col_00) & bVar2) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar14->NextItemData).LineWeight);
          }
          iVar17 = getter->Count;
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 < iVar17);
    }
    pIVar14 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar14->NextItemData);
    pIVar14->PreviousItem = pIVar14->CurrentItem;
    pIVar14->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsEx(const char* label_id, const Getter& getter, double width) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const double half_width = width / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(p.x - half_width, p.y));
                FitPoint(ImPlotPoint(p.x + half_width, 0));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.y == 0)
                continue;
            ImVec2 a = PlotToPixels(p.x - half_width, p.y);
            ImVec2 b = PlotToPixels(p.x + half_width, 0);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}